

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_hsluv.c
# Opt level: O3

void test_rgb2hpluv(void)

{
  double dVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  double dVar5;
  double l;
  double s;
  double h;
  double local_48;
  double local_40;
  double local_38;
  
  lVar3 = 0;
  do {
    acutest_case_("%s",snapshot[0].hex_str + lVar3);
    rgb2hpluv(*(double *)(snapshot[0].hex_str + lVar3 + 8),
              *(double *)(snapshot[0].hex_str + lVar3 + 0x10),
              *(double *)(snapshot[0].hex_str + lVar3 + 0x18),&local_38,&local_40,&local_48);
    dVar1 = *(double *)(snapshot[0].hex_str + lVar3 + 0x80);
    dVar5 = local_38 - dVar1;
    uVar4 = -(ulong)(dVar5 < -dVar5);
    iVar2 = acutest_check_((uint)((double)(~uVar4 & (ulong)dVar5 | (ulong)-dVar5 & uVar4) < 1e-08),
                           "/workspace/llm4binary/github/license_c_cmakelists/hsluv[P]hsluv-c/tests/test_hsluv.c"
                           ,0x58,"%s channel","hue");
    if (iVar2 == 0) {
      acutest_message_("Produced: %f",local_38);
      acutest_message_("Expected: %f",dVar1);
    }
    dVar1 = *(double *)((long)&snapshot[0].hpluv_s + lVar3);
    dVar5 = local_40 - dVar1;
    uVar4 = -(ulong)(dVar5 < -dVar5);
    iVar2 = acutest_check_((uint)((double)(~uVar4 & (ulong)dVar5 | (ulong)-dVar5 & uVar4) < 1e-08),
                           "/workspace/llm4binary/github/license_c_cmakelists/hsluv[P]hsluv-c/tests/test_hsluv.c"
                           ,0x59,"%s channel","saturation");
    if (iVar2 == 0) {
      acutest_message_("Produced: %f",local_40);
      acutest_message_("Expected: %f",dVar1);
    }
    dVar1 = *(double *)((long)&snapshot[0].hpluv_l + lVar3);
    dVar5 = local_48 - dVar1;
    uVar4 = -(ulong)(dVar5 < -dVar5);
    iVar2 = acutest_check_((uint)((double)(~uVar4 & (ulong)dVar5 | (ulong)-dVar5 & uVar4) < 1e-08),
                           "/workspace/llm4binary/github/license_c_cmakelists/hsluv[P]hsluv-c/tests/test_hsluv.c"
                           ,0x5a,"%s channel","lightness");
    if (iVar2 == 0) {
      acutest_message_("Produced: %f",local_48);
      acutest_message_("Expected: %f",dVar1);
    }
    lVar3 = lVar3 + 0x98;
  } while (lVar3 != 0x98000);
  return;
}

Assistant:

static void
test_rgb2hpluv(void)
{
    int i;

    for(i = 0; i < snapshot_n; i++) {
        double h, s, l;

        TEST_CASE(snapshot[i].hex_str);

        rgb2hpluv(snapshot[i].rgb_r, snapshot[i].rgb_g, snapshot[i].rgb_b, &h, &s, &l);

        TEST_CHANNEL("hue", h, snapshot[i].hpluv_h);
        TEST_CHANNEL("saturation", s, snapshot[i].hpluv_s);
        TEST_CHANNEL("lightness", l, snapshot[i].hpluv_l);
    }
}